

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

size_t Curl_ossl_version(char *buffer,size_t size)

{
  uint uVar1;
  int iVar2;
  ulong uStack_28;
  int minor_ver;
  unsigned_long ssleay_value;
  size_t sStack_18;
  char sub [3];
  size_t size_local;
  char *buffer_local;
  
  ssleay_value._7_1_ = 0;
  ssleay_value._6_1_ = '\0';
  sStack_18 = size;
  uStack_28 = OpenSSL_version_num();
  if (uStack_28 < 0x906000) {
    uStack_28 = 0x30000020;
    ssleay_value._5_1_ = '\0';
  }
  else if ((uStack_28 & 0xff0) == 0) {
    ssleay_value._5_1_ = '\0';
  }
  else {
    uVar1 = (uint)(uStack_28 >> 4) & 0xff;
    if (uVar1 < 0x1b) {
      ssleay_value._5_1_ = (char)(uStack_28 >> 4) + '`';
    }
    else {
      ssleay_value._6_1_ = (char)((long)(int)(uVar1 - 1) % 0x1a) + 'b';
      ssleay_value._5_1_ = 'z';
    }
  }
  iVar2 = curl_msnprintf(buffer,sStack_18,"%s/%lx.%lx.%lx%s","OpenSSL",uStack_28 >> 0x1c & 0xf,
                         uStack_28 >> 0x14 & 0xff,uStack_28 >> 0xc & 0xff,(long)&ssleay_value + 5);
  return (long)iVar2;
}

Assistant:

size_t Curl_ossl_version(char *buffer, size_t size)
{
#ifdef OPENSSL_IS_BORINGSSL
  return snprintf(buffer, size, OSSL_PACKAGE);
#else /* OPENSSL_IS_BORINGSSL */
  char sub[3];
  unsigned long ssleay_value;
  sub[2]='\0';
  sub[1]='\0';
  ssleay_value=OpenSSL_version_num();
  if(ssleay_value < 0x906000) {
    ssleay_value=SSLEAY_VERSION_NUMBER;
    sub[0]='\0';
  }
  else {
    if(ssleay_value&0xff0) {
      int minor_ver = (ssleay_value >> 4) & 0xff;
      if(minor_ver > 26) {
        /* handle extended version introduced for 0.9.8za */
        sub[1] = (char) ((minor_ver - 1) % 26 + 'a' + 1);
        sub[0] = 'z';
      }
      else {
        sub[0] = (char) (minor_ver + 'a' - 1);
      }
    }
    else
      sub[0]='\0';
  }

  return snprintf(buffer, size, "%s/%lx.%lx.%lx%s",
                  OSSL_PACKAGE,
                  (ssleay_value>>28)&0xf,
                  (ssleay_value>>20)&0xff,
                  (ssleay_value>>12)&0xff,
                  sub);
#endif /* OPENSSL_IS_BORINGSSL */
}